

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

StructReader * __thiscall
capnp::_::OrphanBuilder::asStructReader
          (StructReader *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  ushort uVar3;
  CapTableReader *pCVar4;
  word *pwVar5;
  Arena *pAVar6;
  ReadLimiter *pRVar7;
  ulong uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar11;
  SegmentBuilder **ppSVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  Fault f;
  SegmentBuilder *pSVar10;
  
  uVar13 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar13 == 0) goto LAB_0029042d;
  pSVar10 = this->segment;
  pCVar4 = &this->capTable->super_CapTableReader;
  ppSVar12 = (SegmentBuilder **)this->location;
  if (pSVar10 == (SegmentBuilder *)0x0) {
    pSVar10 = (SegmentBuilder *)0x0;
LAB_002902c4:
    if (ppSVar12 == (SegmentBuilder **)0x0) goto LAB_0029042d;
LAB_002902d0:
    uVar13 = (uint)(this->tag).content;
LAB_002902d4:
    if ((uVar13 & 3) == 0) {
      uVar2 = *(ushort *)((long)&(this->tag).content + 4);
      uVar3 = *(ushort *)((long)&(this->tag).content + 6);
      if (pSVar10 == (SegmentBuilder *)0x0) {
LAB_00290317:
        __return_storage_ptr__->segment = &pSVar10->super_SegmentReader;
        __return_storage_ptr__->capTable = pCVar4;
        __return_storage_ptr__->data = ppSVar12;
        __return_storage_ptr__->pointers = (WirePointer *)(ppSVar12 + uVar2);
        __return_storage_ptr__->dataSize = (uint)uVar2 << 6;
        __return_storage_ptr__->pointerCount = uVar3;
        __return_storage_ptr__->nestingLimit = 0x7ffffffe;
        return __return_storage_ptr__;
      }
      uVar15 = (ulong)uVar3 + (ulong)uVar2;
      if (((long)ppSVar12 - (long)(pSVar10->super_SegmentReader).ptr.ptr >> 3) + uVar15 <=
          (pSVar10->super_SegmentReader).ptr.size_) {
        pRVar7 = (pSVar10->super_SegmentReader).readLimiter;
        uVar11 = pRVar7->limit;
        if (uVar15 <= uVar11) {
          pRVar7->limit = uVar11 - uVar15;
          goto LAB_00290317;
        }
        (*((pSVar10->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x87e,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                 "\"Message contained out-of-bounds struct pointer.\"",
                 (char (*) [48])"Message contained out-of-bounds struct pointer.");
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[71]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x879,FAILED,"ref->kind() == WirePointer::STRUCT",
                 "\"Message contains non-struct pointer where struct pointer was expected.\"",
                 (char (*) [71])
                 "Message contains non-struct pointer where struct pointer was expected.");
    }
  }
  else {
    if ((uVar13 & 3) != 2) goto LAB_002902c4;
    iVar9 = (*((pSVar10->super_SegmentReader).arena)->_vptr_Arena[2])();
    pSVar10 = (SegmentBuilder *)CONCAT44(extraout_var,iVar9);
    if (pSVar10 != (SegmentBuilder *)0x0) {
      uVar15 = (pSVar10->super_SegmentReader).ptr.size_;
      uVar13 = (uint)(this->tag).content;
      uVar11 = (ulong)(uVar13 >> 3);
      if ((long)uVar15 < (long)(ulong)(uVar13 >> 3)) {
        uVar11 = uVar15;
      }
      uVar16 = 2 - (ulong)((uVar13 & 4) == 0);
      if (uVar15 < uVar11 + uVar16) {
LAB_002903f1:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "\"Message contains out-of-bounds far pointer.\"",
                   (char (*) [44])"Message contains out-of-bounds far pointer.");
        goto LAB_00290425;
      }
      pwVar5 = (pSVar10->super_SegmentReader).ptr.ptr;
      pAVar6 = (pSVar10->super_SegmentReader).arena;
      pRVar7 = (pSVar10->super_SegmentReader).readLimiter;
      uVar8 = pRVar7->limit;
      if (uVar8 < uVar16) {
        (*pAVar6->_vptr_Arena[3])();
        goto LAB_002903f1;
      }
      this = (OrphanBuilder *)(pwVar5 + uVar11);
      ppSVar1 = &this->segment;
      pRVar7->limit = uVar8 - uVar16;
      if ((uVar13 & 4) != 0) {
        iVar9 = (*pAVar6->_vptr_Arena[2])(pAVar6,(ulong)*(uint *)((long)&(this->tag).content + 4));
        pSVar10 = (SegmentBuilder *)CONCAT44(extraout_var_00,iVar9);
        if (pSVar10 == (SegmentBuilder *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x24e,FAILED,"newSegment != nullptr",
                     "\"Message contains double-far pointer to unknown segment.\"",
                     (char (*) [56])"Message contains double-far pointer to unknown segment.");
        }
        else {
          uVar13 = (uint)(this->tag).content;
          if ((uVar13 & 3) == 2) {
            uVar11 = (ulong)(uVar13 >> 3);
            uVar15 = (pSVar10->super_SegmentReader).ptr.size_;
            if ((long)uVar15 < (long)uVar11) {
              uVar11 = uVar15;
            }
            ppSVar12 = (SegmentBuilder **)((pSVar10->super_SegmentReader).ptr.ptr + uVar11);
            this = (OrphanBuilder *)ppSVar1;
            goto LAB_002902c4;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
                     "\"Second word of double-far pad must be far pointer.\"",
                     (char (*) [51])"Second word of double-far pad must be far pointer.");
        }
        goto LAB_00290425;
      }
      uVar13 = (uint)(this->tag).content;
      lVar14 = (long)((int)uVar13 >> 2);
      ppSVar12 = (SegmentBuilder **)(pwVar5 + uVar15);
      if ((lVar14 < (long)pwVar5 - (long)ppSVar1 >> 3) ||
         ((long)ppSVar12 - (long)ppSVar1 >> 3 < lVar14)) goto LAB_002902d0;
      ppSVar12 = ppSVar1 + lVar14;
      goto LAB_002902d4;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x234,FAILED,"segment != nullptr",
               "\"Message contains far pointer to unknown segment.\"",
               (char (*) [49])"Message contains far pointer to unknown segment.");
  }
LAB_00290425:
  kj::_::Debug::Fault::~Fault(&f);
LAB_0029042d:
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->pointers = (WirePointer *)0x0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->pointers + 6) = 0;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

StructReader OrphanBuilder::asStructReader(StructSize size) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readStructPointer(
      segment, capTable, tagAsPtr(), location, nullptr, kj::maxValue);
}